

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<spirv_cross::BuiltInResource,_8UL> * __thiscall
spirv_cross::SmallVector<spirv_cross::BuiltInResource,_8UL>::operator=
          (SmallVector<spirv_cross::BuiltInResource,_8UL> *this,
          SmallVector<spirv_cross::BuiltInResource,_8UL> *other)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  BuiltInResource *pBVar3;
  undefined8 *puVar4;
  void *pvVar5;
  size_t sVar6;
  undefined8 uVar7;
  BuiltInResource *pBVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  
  clear(this);
  pBVar8 = (other->super_VectorView<spirv_cross::BuiltInResource>).ptr;
  if (pBVar8 == (BuiltInResource *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size);
    if ((other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size == 0) {
      uVar9 = 0;
    }
    else {
      lVar11 = 0x28;
      uVar10 = 0;
      do {
        pBVar8 = (this->super_VectorView<spirv_cross::BuiltInResource>).ptr;
        puVar1 = (undefined8 *)((long)&pBVar8->builtin + lVar11);
        pBVar3 = (other->super_VectorView<spirv_cross::BuiltInResource>).ptr;
        puVar2 = (undefined8 *)((long)&pBVar3->builtin + lVar11);
        *(undefined8 *)((long)pBVar8 + lVar11 + -0x28) =
             *(undefined8 *)((long)pBVar3 + lVar11 + -0x28);
        *(undefined8 *)((long)pBVar8 + lVar11 + -0x20) =
             *(undefined8 *)((long)pBVar3 + lVar11 + -0x20);
        *(undefined4 *)((long)pBVar8 + lVar11 + -0x18) =
             *(undefined4 *)((long)pBVar3 + lVar11 + -0x18);
        *(undefined8 **)((long)pBVar8 + lVar11 + -0x10) = puVar1;
        puVar4 = *(undefined8 **)((long)pBVar3 + lVar11 + -0x10);
        if (puVar2 == puVar4) {
          uVar7 = puVar2[1];
          *puVar1 = *puVar2;
          puVar1[1] = uVar7;
        }
        else {
          *(undefined8 **)((long)pBVar8 + lVar11 + -0x10) = puVar4;
          *(undefined8 *)((long)&pBVar8->builtin + lVar11) = *puVar2;
        }
        *(undefined8 *)((long)pBVar8 + lVar11 + -8) = *(undefined8 *)((long)pBVar3 + lVar11 + -8);
        *(undefined8 **)((long)pBVar3 + lVar11 + -0x10) = puVar2;
        *(undefined8 *)((long)pBVar3 + lVar11 + -8) = 0;
        *(undefined1 *)((long)&pBVar3->builtin + lVar11) = 0;
        pBVar8 = (other->super_VectorView<spirv_cross::BuiltInResource>).ptr;
        pvVar5 = *(void **)((long)pBVar8 + lVar11 + -0x10);
        if ((void *)((long)&pBVar8->builtin + lVar11) != pvVar5) {
          operator_delete(pvVar5);
        }
        uVar10 = uVar10 + 1;
        uVar9 = (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
        lVar11 = lVar11 + 0x38;
      } while (uVar10 < uVar9);
    }
    (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = uVar9;
    (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = 0;
  }
  else {
    pBVar3 = (this->super_VectorView<spirv_cross::BuiltInResource>).ptr;
    if (pBVar3 != (BuiltInResource *)&this->stack_storage) {
      free(pBVar3);
      pBVar8 = (other->super_VectorView<spirv_cross::BuiltInResource>).ptr;
    }
    (this->super_VectorView<spirv_cross::BuiltInResource>).ptr = pBVar8;
    sVar6 = other->buffer_capacity;
    (this->super_VectorView<spirv_cross::BuiltInResource>).buffer_size =
         (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
    this->buffer_capacity = sVar6;
    (other->super_VectorView<spirv_cross::BuiltInResource>).ptr = (BuiltInResource *)0x0;
    (other->super_VectorView<spirv_cross::BuiltInResource>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}